

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_delta_q_params(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  char cVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  MB_MODE_INFO *in_RDX;
  aom_reader *in_RSI;
  AV1_COMMON *in_RDI;
  AV1_COMMON *unaff_retaddr;
  int tmp_lvl_1;
  int tmp_lvl;
  int lf_id;
  int frame_lf_count;
  int mi_col;
  int mi_row;
  FRAME_CONTEXT *ec_ctx;
  MB_MODE_INFO *mbmi;
  DeltaQInfo *delta_q_info;
  int local_40;
  DeltaQInfo *pDVar5;
  
  pDVar5 = &in_RDI->delta_q_info;
  if (pDVar5->delta_q_present_flag != 0) {
    lVar2 = **(long **)&in_RSI[0x7a].allow_update_cdf;
    iVar3 = read_delta_qindex(unaff_retaddr,(MACROBLOCKD *)in_RDI,in_RSI,in_RDX);
    *(int *)((long)&in_RSI[0xa7].ec.end + 4) =
         iVar3 * pDVar5->delta_q_res + *(int *)((long)&in_RSI[0xa7].ec.end + 4);
    iVar3 = clamp(*(int *)((long)&in_RSI[0xa7].ec.end + 4),1,0xff);
    *(int *)((long)&in_RSI[0xa7].ec.end + 4) = iVar3;
    if (pDVar5->delta_lf_present_flag != 0) {
      if (pDVar5->delta_lf_multi == 0) {
        cVar1 = *(char *)&in_RSI[0xa8].buffer;
        iVar3 = read_delta_lflevel(unaff_retaddr,(aom_reader *)in_RDI,(aom_cdf_prob *)in_RSI,in_RDX,
                                   (int)((ulong)pDVar5 >> 0x20),(int)pDVar5);
        iVar3 = clamp((int)cVar1 + iVar3 * pDVar5->delta_lf_res,-0x3f,0x3f);
        *(char *)&in_RSI[0xa8].buffer = (char)iVar3;
        *(char *)(lVar2 + 0xa2) = (char)iVar3;
      }
      else {
        iVar3 = av1_num_planes(in_RDI);
        iVar4 = 2;
        if (1 < iVar3) {
          iVar4 = 4;
        }
        for (local_40 = 0; local_40 < iVar4; local_40 = local_40 + 1) {
          cVar1 = *(char *)((long)&in_RSI[0xa8].buffer + (long)local_40 + 1);
          iVar3 = read_delta_lflevel(unaff_retaddr,(aom_reader *)in_RDI,(aom_cdf_prob *)in_RSI,
                                     in_RDX,(int)((ulong)pDVar5 >> 0x20),(int)pDVar5);
          iVar3 = clamp((int)cVar1 + iVar3 * pDVar5->delta_lf_res,-0x3f,0x3f);
          *(char *)((long)&in_RSI[0xa8].buffer + (long)local_40 + 1) = (char)iVar3;
          *(char *)(lVar2 + 0xa3 + (long)local_40) = (char)iVar3;
        }
      }
    }
  }
  return;
}

Assistant:

static void read_delta_q_params(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                aom_reader *r) {
  DeltaQInfo *const delta_q_info = &cm->delta_q_info;

  if (delta_q_info->delta_q_present_flag) {
    MB_MODE_INFO *const mbmi = xd->mi[0];
    xd->current_base_qindex +=
        read_delta_qindex(cm, xd, r, mbmi) * delta_q_info->delta_q_res;
    /* Normative: Clamp to [1,MAXQ] to not interfere with lossless mode */
    xd->current_base_qindex = clamp(xd->current_base_qindex, 1, MAXQ);
    FRAME_CONTEXT *const ec_ctx = xd->tile_ctx;
    if (delta_q_info->delta_lf_present_flag) {
      const int mi_row = xd->mi_row;
      const int mi_col = xd->mi_col;
      if (delta_q_info->delta_lf_multi) {
        const int frame_lf_count =
            av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          const int tmp_lvl =
              xd->delta_lf[lf_id] +
              read_delta_lflevel(cm, r, ec_ctx->delta_lf_multi_cdf[lf_id], mbmi,
                                 mi_col, mi_row) *
                  delta_q_info->delta_lf_res;
          mbmi->delta_lf[lf_id] = xd->delta_lf[lf_id] =
              clamp(tmp_lvl, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
        }
      } else {
        const int tmp_lvl = xd->delta_lf_from_base +
                            read_delta_lflevel(cm, r, ec_ctx->delta_lf_cdf,
                                               mbmi, mi_col, mi_row) *
                                delta_q_info->delta_lf_res;
        mbmi->delta_lf_from_base = xd->delta_lf_from_base =
            clamp(tmp_lvl, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
      }
    }
  }
}